

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::anon_unknown_6::TileBufferTask::execute(TileBufferTask *this)

{
  pointer pTVar1;
  TileBuffer *pTVar2;
  Data *pDVar3;
  pointer pTVar4;
  size_t xStride;
  char *pcVar5;
  long *plVar6;
  int iVar7;
  long lVar8;
  int y;
  int iVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  size_t numPixels;
  Box2i tileRange;
  char *writePtr;
  char *readPtr;
  char *compPtr;
  char *local_48 [2];
  int local_38;
  int local_34;
  
  pTVar2 = this->_tileBuffer;
  writePtr = (pTVar2->buffer)._data;
  pDVar3 = this->_ofd;
  Imf_3_4::dataWindowForTile
            ((Imf_3_4 *)&tileRange,&pDVar3->tileDesc,pDVar3->minX,pDVar3->maxX,pDVar3->minY,
             pDVar3->maxY,*(int *)&pTVar2->compressor,*(int *)((long)&pTVar2->compressor + 4),
             (int)(pTVar2->sampleCountTableBuffer)._size,
             *(int *)((long)&(pTVar2->sampleCountTableBuffer)._size + 4));
  iVar7 = tileRange.max.y - tileRange.min.y;
  lVar10 = (long)tileRange.max.x;
  lVar8 = (long)tileRange.min.x;
  numPixels = (size_t)((int)(lVar10 - lVar8) + 1);
  for (iVar9 = tileRange.min.y; iVar9 <= tileRange.max.y; iVar9 = iVar9 + 1) {
    uVar11 = 0;
    while( true ) {
      uVar12 = (ulong)uVar11;
      pDVar3 = this->_ofd;
      pTVar4 = (pDVar3->slices).
               super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(pDVar3->slices).
                         super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4) / 0x30) <=
          uVar12) break;
      pTVar1 = pTVar4 + uVar12;
      if (pTVar4[uVar12].zero == true) {
        fillChannelWithZeroes(&writePtr,pDVar3->format,pTVar1->type,numPixels);
      }
      else {
        xStride = pTVar1->xStride;
        readPtr = pTVar1->base +
                  (long)(iVar9 - tileRange.min.y * pTVar1->yTileCoords) * pTVar1->yStride +
                  (long)((1 - pTVar1->xTileCoords) * tileRange.min.x) * xStride;
        copyFromFrameBuffer(&writePtr,&readPtr,readPtr + xStride * (lVar10 - lVar8),xStride,
                            pDVar3->format,pTVar1->type);
      }
      uVar11 = uVar11 + 1;
    }
  }
  pTVar2 = this->_tileBuffer;
  pcVar5 = (pTVar2->buffer)._data;
  plVar6 = (long *)pTVar2->uncompressedSize;
  *(int *)&pTVar2->dataSize = (int)writePtr - (int)pcVar5;
  pTVar2->dataPtr = pcVar5;
  if (plVar6 != (long *)0x0) {
    plVar6[0x8a] = (pTVar2->sampleCountTableBuffer)._size;
    local_38 = tileRange.max.x;
    local_34 = tileRange.max.y;
    iVar9 = (**(code **)(*plVar6 + 0x28))();
    pTVar2 = this->_tileBuffer;
    if (iVar9 < (int)pTVar2->dataSize) {
      *(int *)&pTVar2->dataSize = iVar9;
      pTVar2->dataPtr = compPtr;
    }
    else {
      pDVar3 = this->_ofd;
      if (pDVar3->format == NATIVE) {
        readPtr = (pTVar2->buffer)._data;
        iVar9 = -1;
        if (-1 < iVar7) {
          iVar9 = iVar7;
        }
        local_48[0] = readPtr;
        for (iVar7 = 0; iVar7 != iVar9 + 1; iVar7 = iVar7 + 1) {
          uVar11 = 0;
          while( true ) {
            pTVar4 = (pDVar3->slices).
                     super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(pDVar3->slices).
                               super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4) / 0x30) <=
                (ulong)uVar11) break;
            convertInPlace(&readPtr,local_48,pTVar4[uVar11].type,numPixels);
            uVar11 = uVar11 + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
TileBufferTask::execute ()
{
    try
    {
        //
        // First copy the pixel data from the frame buffer
        // into the tile buffer
        //
        // Convert one tile's worth of pixel data to
        // a machine-independent representation, and store
        // the result in _tileBuffer->buffer.
        //

        char* writePtr = _tileBuffer->buffer;

        Box2i tileRange = dataWindowForTile (
            _ofd->tileDesc,
            _ofd->minX,
            _ofd->maxX,
            _ofd->minY,
            _ofd->maxY,
            _tileBuffer->tileCoord.dx,
            _tileBuffer->tileCoord.dy,
            _tileBuffer->tileCoord.lx,
            _tileBuffer->tileCoord.ly);

        int numScanLines         = tileRange.max.y - tileRange.min.y + 1;
        int numPixelsPerScanLine = tileRange.max.x - tileRange.min.x + 1;

        //
        // Iterate over the scan lines in the tile.
        //

        for (int y = tileRange.min.y; y <= tileRange.max.y; ++y)
        {
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ofd->slices.size (); ++i)
            {
                const TOutSliceInfo& slice = _ofd->slices[i];

                //
                // These offsets are used to facilitate both absolute
                // and tile-relative pixel coordinates.
                //

                int xOffset = slice.xTileCoords * tileRange.min.x;
                int yOffset = slice.yTileCoords * tileRange.min.y;

                //
                // Fill the tile buffer with pixel data.
                //

                if (slice.zero)
                {
                    //
                    // The frame buffer contains no data for this channel.
                    // Store zeroes in _data->tileBuffer.
                    //

                    fillChannelWithZeroes (
                        writePtr,
                        _ofd->format,
                        slice.type,
                        numPixelsPerScanLine);
                }
                else
                {
                    //
                    // The frame buffer contains data for this channel.
                    //

                    intptr_t    base = reinterpret_cast<intptr_t> (slice.base);
                    const char* readPtr = reinterpret_cast<const char*> (
                        base + (y - yOffset) * slice.yStride +
                        (tileRange.min.x - xOffset) * slice.xStride);

                    const char* endPtr =
                        readPtr + (numPixelsPerScanLine - 1) * slice.xStride;

                    copyFromFrameBuffer (
                        writePtr,
                        readPtr,
                        endPtr,
                        slice.xStride,
                        _ofd->format,
                        slice.type);
                }
            }
        }

        //
        // Compress the contents of the tileBuffer,
        // and store the compressed data in the output file.
        //

        _tileBuffer->dataSize = writePtr - _tileBuffer->buffer;
        _tileBuffer->dataPtr  = _tileBuffer->buffer;

        if (_tileBuffer->compressor)
        {
            const char* compPtr;

            _tileBuffer->compressor->setTileLevel (
                _tileBuffer->tileCoord.lx,
                _tileBuffer->tileCoord.ly);
            int compSize = _tileBuffer->compressor->compressTile (
                _tileBuffer->dataPtr,
                _tileBuffer->dataSize,
                tileRange,
                compPtr);

            if (compSize < _tileBuffer->dataSize)
            {
                _tileBuffer->dataSize = compSize;
                _tileBuffer->dataPtr  = compPtr;
            }
            else if (_ofd->format == Compressor::NATIVE)
            {
                //
                // The data did not shrink during compression, but
                // we cannot write to the file using native format,
                // so we need to convert the lineBuffer to Xdr.
                //

                convertToXdr (
                    _ofd,
                    _tileBuffer->buffer,
                    numScanLines,
                    numPixelsPerScanLine);
            }
        }
    }
    catch (std::exception& e)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = e.what ();
            _tileBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = "unrecognized exception";
            _tileBuffer->hasException = true;
        }
    }
}